

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

int CMcontrol_list_wait(CMControlList cl)

{
  FILE *__stream;
  pthread_t pVar1;
  pthread_t pVar2;
  CMControlList in_RDI;
  
  if (in_RDI->server_thread != 0) {
    pVar2 = in_RDI->server_thread;
    pVar1 = pthread_self();
    if (pVar2 != pVar1) {
      fprintf(_stderr,"Warning:  Multiple threads calling CMnetwork_wait\n");
      fprintf(_stderr,"          This situation may result in unexpected I/O blocking.\n");
      __stream = _stderr;
      pVar2 = pthread_self();
      fprintf(__stream,"          Server thread set to %zx.\n",pVar2);
    }
  }
  pVar2 = pthread_self();
  in_RDI->server_thread = pVar2;
  if ((in_RDI->network_blocking_function).func != (CMPollFunc)0x0) {
    (*(in_RDI->network_blocking_function).func)
              ((CManager)&CMstatic_trans_svcs,(in_RDI->network_blocking_function).client_data);
  }
  CMcontrol_list_poll(in_RDI);
  return 1;
}

Assistant:

extern
int
CMcontrol_list_wait(CMControlList cl)
{
    /* associated CM should be locked */
    if ((cl->server_thread != 0) &&
	(cl->server_thread != thr_thread_self())) {
	/* What?  We're polling, but we're not the server thread? */
	fprintf(stderr, "Warning:  Multiple threads calling CMnetwork_wait\n");
	fprintf(stderr, "          This situation may result in unexpected I/O blocking.\n");
	fprintf(stderr, "          Server thread set to %zx.\n", (size_t) thr_thread_self());
    }
    cl->server_thread = thr_thread_self();
    if (cl->network_blocking_function.func != NULL) {
	cl->network_blocking_function.func((void*)&CMstatic_trans_svcs,
					   cl->network_blocking_function.client_data);
    }
    CMcontrol_list_poll(cl);
    return 1;
}